

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O3

void __thiscall
FastPForLib::FastBinaryPacking<8U>::encodeArray
          (FastBinaryPacking<8U> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint32_t *out_00;
  long lVar4;
  uint32_t *puVar5;
  int iVar6;
  uint32_t *in_00;
  uint32_t i;
  uint32_t Bs [4];
  uint32_t local_58 [3];
  uint local_4c;
  uint32_t *local_40;
  size_t *local_38;
  
  local_38 = nvalue;
  checkifdivisibleby(length,0x20);
  out_00 = out + 1;
  *out = (uint32_t)length;
  local_40 = out;
  if (0x1f < (long)length) {
    puVar1 = in + length;
    puVar5 = in + 0x20;
    do {
      lVar4 = 0;
      do {
        auVar2 = vpor_avx(SUB3216(*(undefined1 (*) [32])(in + lVar4 * 2),0),
                          SUB3216(*(undefined1 (*) [32])(in + lVar4 * 2),0x10));
        auVar3 = vpshufd_avx(auVar2,0xee);
        auVar2 = vpor_avx(auVar2,auVar3);
        auVar3 = vpshufd_avx(auVar2,0x55);
        auVar2 = vpor_avx(auVar2,auVar3);
        iVar6 = 0x20 - LZCOUNT(auVar2._0_4_);
        if (auVar2._0_4_ == 0) {
          iVar6 = 0;
        }
        *(int *)((long)local_58 + lVar4) = iVar6;
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      lVar4 = 0;
      *out_00 = local_58[2] << 8 | local_58[1] << 0x10 | local_58[0] << 0x18 | local_4c;
      out_00 = out_00 + 1;
      in_00 = in;
      do {
        out_00 = fastpackwithoutmask_8(in_00,out_00,local_58[lVar4]);
        lVar4 = lVar4 + 1;
        in_00 = in_00 + 8;
      } while (lVar4 != 4);
      puVar5 = puVar5 + 0x20;
      in = in + 0x20;
    } while (puVar5 <= puVar1);
  }
  *local_38 = (long)out_00 - (long)local_40 >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) override {
    checkifdivisibleby(length, BlockSize);
    const uint32_t *const initout(out);
    *out++ = static_cast<uint32_t>(length);
    uint32_t Bs[HowManyMiniBlocks];
    for (const uint32_t *const final = in + length; in + BlockSize <= final;
         in += BlockSize) {
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i)
        Bs[i] = maxbits(in + i * MiniBlockSize, in + (i + 1) * MiniBlockSize);
      *out++ = (Bs[0] << 24) | (Bs[1] << 16) | (Bs[2] << 8) | Bs[3];
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        if (MiniBlockSize == 8)
          out = fastpackwithoutmask_8(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 16)
          out = fastpackwithoutmask_16(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 24)
          out = fastpackwithoutmask_24(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 32) {
          fastpackwithoutmask(in + i * MiniBlockSize, out, Bs[i]);
          out += Bs[i];

        } else
          throw std::logic_error("unsupported MiniBlockSize");
      }
    }
    nvalue = out - initout;
  }